

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O1

bool __thiscall Pig::skipWS(Pig *this)

{
  size_type *i;
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  
  i = &this->_cursor;
  uVar1 = this->_cursor;
  uVar3 = utf8_next_char((this->_text).
                         super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,i);
  if (uVar3 != 0) {
    bVar2 = unicodeWhitespace(uVar3);
    uVar4 = uVar1;
    while (bVar2 != false) {
      uVar4 = this->_cursor;
      uVar3 = utf8_next_char((this->_text).
                             super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,i);
      if (uVar3 == 0) goto LAB_00114fb7;
      bVar2 = unicodeWhitespace(uVar3);
    }
    *i = uVar4;
  }
LAB_00114fb7:
  return uVar1 < *i;
}

Assistant:

bool Pig::skipWS ()
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (! unicodeWhitespace (c))
    {
      _cursor = prev;
      break;
    }
    prev = _cursor;
  }

  return _cursor > save;
}